

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall ot::commissioner::CommissionerImpl::LoggingConfig(CommissionerImpl *this)

{
  char *pcVar1;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  allocator local_a9;
  pointer local_a8;
  char *pcStack_a0;
  size_t local_98;
  undefined8 local_90;
  format_string_checker<char> *local_88;
  code *local_80;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"config",&local_a9);
  local_a8 = (pointer)CONCAT44(local_a8._4_4_,string_type);
  pcStack_a0 = "Id = {}";
  local_98 = 7;
  local_90._0_4_ = 0;
  local_90._4_4_ = 1;
  local_80 = ::fmt::v10::detail::
             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
  pcVar1 = "Id = {}";
  local_88 = (format_string_checker<char> *)&local_a8;
  while( true ) {
    while( true ) {
      pcVar2 = pcVar1;
      if (pcVar2 == "") {
        local_a8 = (this->mConfig).mId._M_dataplus._M_p;
        pcStack_a0 = (char *)(this->mConfig).mId._M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x7;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_a8;
        ::fmt::v10::vformat_abi_cxx11_(&local_70,(v10 *)"Id = {}",fmt,args);
        Log(kInfo,&local_50,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::string((string *)&local_50,"config",&local_a9);
        local_a8 = (pointer)CONCAT44(local_a8._4_4_,bool_type);
        pcStack_a0 = "enable CCM = {}";
        local_98 = 0xf;
        local_90._0_4_ = 0;
        local_90._4_4_ = 1;
        local_80 = ::fmt::v10::detail::
                   parse_format_specs<bool,fmt::v10::detail::compile_parse_context<char>>;
        pcVar1 = "enable CCM = {}";
        local_88 = (format_string_checker<char> *)&local_a8;
        while( true ) {
          while( true ) {
            pcVar2 = pcVar1;
            if (pcVar2 == "") {
              local_a8 = (pointer)(ulong)(this->mConfig).mEnableCcm;
              fmt_00.size_ = 7;
              fmt_00.data_ = (char *)0xf;
              args_00.field_1.args_ = in_R9.args_;
              args_00.desc_ = (unsigned_long_long)&local_a8;
              ::fmt::v10::vformat_abi_cxx11_(&local_70,(v10 *)"enable CCM = {}",fmt_00,args_00);
              Log(kInfo,&local_50,&local_70);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::string((string *)&local_50,"config",&local_a9);
              local_a8 = (pointer)CONCAT44(local_a8._4_4_,string_type);
              pcStack_a0 = "domain name = {}";
              local_98 = 0x10;
              local_90._0_4_ = 0;
              local_90._4_4_ = 1;
              local_80 = ::fmt::v10::detail::
                         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
              ;
              pcVar1 = "domain name = {}";
              local_88 = (format_string_checker<char> *)&local_a8;
              while( true ) {
                while( true ) {
                  pcVar2 = pcVar1;
                  if (pcVar2 == "") {
                    local_a8 = (this->mConfig).mDomainName._M_dataplus._M_p;
                    pcStack_a0 = (char *)(this->mConfig).mDomainName._M_string_length;
                    fmt_01.size_ = 0xd;
                    fmt_01.data_ = (char *)0x10;
                    args_01.field_1.args_ = in_R9.args_;
                    args_01.desc_ = (unsigned_long_long)&local_a8;
                    ::fmt::v10::vformat_abi_cxx11_
                              (&local_70,(v10 *)"domain name = {}",fmt_01,args_01);
                    Log(kInfo,&local_50,&local_70);
                    std::__cxx11::string::~string((string *)&local_70);
                    std::__cxx11::string::~string((string *)&local_50);
                    std::__cxx11::string::string((string *)&local_50,"config",&local_a9);
                    local_a8 = (pointer)CONCAT44(local_a8._4_4_,uint_type);
                    pcStack_a0 = "keep alive interval = {}";
                    local_98 = 0x18;
                    local_90._0_4_ = 0;
                    local_90._4_4_ = 1;
                    local_80 = ::fmt::v10::detail::
                               parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>
                    ;
                    pcVar1 = "keep alive interval = {}";
                    local_88 = (format_string_checker<char> *)&local_a8;
                    while( true ) {
                      while( true ) {
                        pcVar2 = pcVar1;
                        if (pcVar2 == "") {
                          local_a8 = (pointer)(ulong)(this->mConfig).mKeepAliveInterval;
                          fmt_02.size_ = 2;
                          fmt_02.data_ = (char *)0x18;
                          args_02.field_1.args_ = in_R9.args_;
                          args_02.desc_ = (unsigned_long_long)&local_a8;
                          ::fmt::v10::vformat_abi_cxx11_
                                    (&local_70,(v10 *)"keep alive interval = {}",fmt_02,args_02);
                          Log(kInfo,&local_50,&local_70);
                          std::__cxx11::string::~string((string *)&local_70);
                          std::__cxx11::string::~string((string *)&local_50);
                          std::__cxx11::string::string((string *)&local_50,"config",&local_a9);
                          local_a8 = (pointer)CONCAT44(local_a8._4_4_,bool_type);
                          pcStack_a0 = "enable DTLS debug logging = {}";
                          local_98 = 0x1e;
                          local_90._0_4_ = 0;
                          local_90._4_4_ = 1;
                          local_80 = ::fmt::v10::detail::
                                     parse_format_specs<bool,fmt::v10::detail::compile_parse_context<char>>
                          ;
                          pcVar1 = "enable DTLS debug logging = {}";
                          local_88 = (format_string_checker<char> *)&local_a8;
                          while( true ) {
                            while( true ) {
                              pcVar2 = pcVar1;
                              if (pcVar2 == "") {
                                local_a8 = (pointer)(ulong)(this->mConfig).mEnableDtlsDebugLogging;
                                fmt_03.size_ = 7;
                                fmt_03.data_ = (char *)0x1e;
                                args_03.field_1.args_ = in_R9.args_;
                                args_03.desc_ = (unsigned_long_long)&local_a8;
                                ::fmt::v10::vformat_abi_cxx11_
                                          (&local_70,(v10 *)"enable DTLS debug logging = {}",fmt_03,
                                           args_03);
                                Log(kInfo,&local_50,&local_70);
                                std::__cxx11::string::~string((string *)&local_70);
                                std::__cxx11::string::~string((string *)&local_50);
                                std::__cxx11::string::string((string *)&local_50,"config",&local_a9)
                                ;
                                local_a8 = (pointer)CONCAT44(local_a8._4_4_,uint_type);
                                pcStack_a0 = "maximum connection number = {}";
                                local_98 = 0x1e;
                                local_90._0_4_ = 0;
                                local_90._4_4_ = 1;
                                local_80 = ::fmt::v10::detail::
                                           parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>
                                ;
                                pcVar1 = "maximum connection number = {}";
                                local_88 = (format_string_checker<char> *)&local_a8;
                                while( true ) {
                                  while( true ) {
                                    pcVar2 = pcVar1;
                                    if (pcVar2 == "") {
                                      local_a8 = (pointer)(ulong)(this->mConfig).mMaxConnectionNum;
                                      fmt_04.size_ = 2;
                                      fmt_04.data_ = (char *)0x1e;
                                      args_04.field_1.args_ = in_R9.args_;
                                      args_04.desc_ = (unsigned_long_long)&local_a8;
                                      ::fmt::v10::vformat_abi_cxx11_
                                                (&local_70,(v10 *)"maximum connection number = {}",
                                                 fmt_04,args_04);
                                      Log(kInfo,&local_50,&local_70);
                                      std::__cxx11::string::~string((string *)&local_70);
                                      std::__cxx11::string::~string((string *)&local_50);
                                      return;
                                    }
                                    pcVar1 = pcVar2 + 1;
                                    if (*pcVar2 == '}') break;
                                    if (*pcVar2 == '{') {
                                      pcVar1 = ::fmt::v10::detail::
                                               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_int>&>
                                                         (pcVar2,"",
                                                          (format_string_checker<char> *)&local_a8);
                                    }
                                  }
                                  if ((pcVar1 == "") || (*pcVar1 != '}')) break;
                                  pcVar1 = pcVar2 + 2;
                                }
                                ::fmt::v10::detail::throw_format_error
                                          ("unmatched \'}\' in format string");
                              }
                              pcVar1 = pcVar2 + 1;
                              if (*pcVar2 == '}') break;
                              if (*pcVar2 == '{') {
                                pcVar1 = ::fmt::v10::detail::
                                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,bool>&>
                                                   (pcVar2,"",
                                                    (format_string_checker<char> *)&local_a8);
                              }
                            }
                            if ((pcVar1 == "") || (*pcVar1 != '}')) break;
                            pcVar1 = pcVar2 + 2;
                          }
                          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string")
                          ;
                        }
                        pcVar1 = pcVar2 + 1;
                        if (*pcVar2 == '}') break;
                        if (*pcVar2 == '{') {
                          pcVar1 = ::fmt::v10::detail::
                                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_int>&>
                                             (pcVar2,"",(format_string_checker<char> *)&local_a8);
                        }
                      }
                      if ((pcVar1 == "") || (*pcVar1 != '}')) break;
                      pcVar1 = pcVar2 + 2;
                    }
                    ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                  }
                  pcVar1 = pcVar2 + 1;
                  if (*pcVar2 == '}') break;
                  if (*pcVar2 == '{') {
                    pcVar1 = ::fmt::v10::detail::
                             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                       (pcVar2,"",(format_string_checker<char> *)&local_a8);
                  }
                }
                if ((pcVar1 == "") || (*pcVar1 != '}')) break;
                pcVar1 = pcVar2 + 2;
              }
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar1 = pcVar2 + 1;
            if (*pcVar2 == '}') break;
            if (*pcVar2 == '{') {
              pcVar1 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,bool>&>
                                 (pcVar2,"",(format_string_checker<char> *)&local_a8);
            }
          }
          if ((pcVar1 == "") || (*pcVar1 != '}')) break;
          pcVar1 = pcVar2 + 2;
        }
        ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
      }
      pcVar1 = pcVar2 + 1;
      if (*pcVar2 == '}') break;
      if (*pcVar2 == '{') {
        pcVar1 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar2,"",(format_string_checker<char> *)&local_a8);
      }
    }
    if ((pcVar1 == "") || (*pcVar1 != '}')) break;
    pcVar1 = pcVar2 + 2;
  }
  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
}

Assistant:

void CommissionerImpl::LoggingConfig()
{
    LOG_INFO(LOG_REGION_CONFIG, "Id = {}", mConfig.mId);
    LOG_INFO(LOG_REGION_CONFIG, "enable CCM = {}", mConfig.mEnableCcm);
    LOG_INFO(LOG_REGION_CONFIG, "domain name = {}", mConfig.mDomainName);
    LOG_INFO(LOG_REGION_CONFIG, "keep alive interval = {}", mConfig.mKeepAliveInterval);
    LOG_INFO(LOG_REGION_CONFIG, "enable DTLS debug logging = {}", mConfig.mEnableDtlsDebugLogging);
    LOG_INFO(LOG_REGION_CONFIG, "maximum connection number = {}", mConfig.mMaxConnectionNum);

    // Do not logging credentials
}